

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::on_name_lookup
          (torrent *this,error_code *e,
          vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *addrs,
          int port,iterator web)

{
  uint uVar1;
  pointer paVar2;
  _List_node_base *p_Var3;
  pointer pcVar4;
  undefined1 *puVar5;
  _Atomic_word *p_Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  time_point32 tVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  endpoint *ep;
  const_iterator __begin2;
  pointer a;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined1 local_78 [40];
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  (*(this->super_request_callback)._vptr_request_callback[7])
            (this,"completed resolve: %s",web._M_node[1]._M_next);
  *(undefined1 *)((long)&web._M_node[0xb]._M_next + 1) = 0;
  if (*(char *)((long)&web._M_node[0xb]._M_next + 2) == '\x01') {
    (*(this->super_request_callback)._vptr_request_callback[7])(this,"removed web seed");
    remove_web_seed_iter(this,web);
  }
  else if (((this->super_torrent_hot_members).field_0x4b & 4) == 0) {
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (web._M_node + 1);
    if (e->failed_ == false) {
      a = (addrs->
          super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>).
          _M_impl.super__Vector_impl_data._M_start;
      paVar2 = (addrs->
               super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (a != paVar2) {
        do {
          if ((*(char *)((long)&web._M_node[0xb]._M_next + 5) != '\x01') ||
             (bVar8 = is_global(a), bVar8)) {
            local_a0._0_2_ = (unsigned_short)port;
            ::std::
            vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
            ::emplace_back<boost::asio::ip::address_const&,unsigned_short>
                      ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                        *)(web._M_node + 7),a,(unsigned_short *)local_a0);
            iVar9 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
            if ((char)iVar9 != '\0') {
              boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                        ((basic_endpoint<boost::asio::ip::tcp> *)local_78,a,(unsigned_short)port);
              print_endpoint_abi_cxx11_((string *)local_a0,(aux *)local_78,ep);
              (*(this->super_request_callback)._vptr_request_callback[7])
                        (this,"  -> %s",local_a0._0_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._0_8_ != &local_90) {
                operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
              }
            }
          }
          a = a + 1;
        } while (a != paVar2);
        if (web._M_node[7]._M_next == web._M_node[7]._M_prev) {
          iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[5])();
          pbVar7 = local_80;
          if ((*(uint *)(CONCAT44(extraout_var_02,iVar9) + 0x68) & 3) != 0) {
            iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[5])();
            get_handle((torrent *)local_78);
            local_a0._0_4_ = 0x59;
            alert_manager::
            emplace_alert<libtorrent::url_seed_alert,libtorrent::torrent_handle,std::__cxx11::string&,libtorrent::errors::error_code_enum>
                      ((alert_manager *)CONCAT44(extraout_var_03,iVar9),(torrent_handle *)local_78,
                       pbVar7,(error_code_enum *)local_a0);
            if ((_Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 )local_78._8_8_ != (piece_picker *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var6 = (_Atomic_word *)(local_78._8_8_ + 0xc);
                iVar9 = *p_Var6;
                *p_Var6 = *p_Var6 + -1;
                UNLOCK();
              }
              else {
                iVar9 = *(_Atomic_word *)(local_78._8_8_ + 0xc);
                *(int *)(local_78._8_8_ + 0xc) = iVar9 + -1;
              }
              if (iVar9 == 1) {
                (*(code *)(((vector<piece_pos,_piece_index_t> *)local_78._8_8_)->
                          super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ).
                          super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ._M_impl.super__Vector_impl_data._M_start[3])();
              }
            }
          }
          *(undefined1 *)((long)&web._M_node[0xb]._M_next + 6) = 1;
          return;
        }
        if ((int)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x21
                        ) & 0xffffff) <=
            (int)((ulong)((long)(this->super_torrent_hot_members).m_connections.
                                super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                .
                                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_torrent_hot_members).m_connections.
                               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                               .
                               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) -
            (int)((ulong)((long)(this->m_peers_to_disconnect).
                                super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_peers_to_disconnect).
                               super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
          return;
        }
        iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x1e])();
        iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x2e])();
        iVar10 = session_settings::get_int((session_settings *)CONCAT44(extraout_var,iVar10),0x4055)
        ;
        if (iVar10 <= iVar9) {
          return;
        }
        p_Var3 = web._M_node[7]._M_next;
        local_78._32_8_ = p_Var3->_M_next;
        uStack_44 = *(undefined8 *)((long)&p_Var3[1]._M_next + 4);
        uStack_48 = (undefined4)((ulong)*(undefined8 *)((long)&p_Var3->_M_prev + 4) >> 0x20);
        uStack_50 = SUB84(p_Var3->_M_prev,0);
        uStack_4c = (undefined4)((ulong)p_Var3->_M_prev >> 0x20);
        connect_web_seed(this,web,(endpoint *)(local_78 + 0x20));
        return;
      }
    }
    iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    pbVar7 = local_80;
    if ((*(uint *)(CONCAT44(extraout_var_00,iVar9) + 0x68) & 3) != 0) {
      iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_78);
      alert_manager::
      emplace_alert<libtorrent::url_seed_alert,libtorrent::torrent_handle,std::__cxx11::string&,boost::system::error_code_const&>
                ((alert_manager *)CONCAT44(extraout_var_01,iVar9),(torrent_handle *)local_78,pbVar7,
                 e);
      if ((piece_picker *)local_78._8_8_ != (piece_picker *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          puVar5 = (undefined1 *)
                   ((long)&(((vector<piece_pos,_piece_index_t> *)local_78._8_8_)->
                           super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                           ).
                           super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 4);
          iVar9 = *(int *)puVar5;
          *(int *)puVar5 = *(int *)puVar5 + -1;
          UNLOCK();
        }
        else {
          iVar9 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_78._8_8_)->
                                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ).
                                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4);
          *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_78._8_8_)->
                          super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ).
                          super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar9 + -1;
        }
        if (iVar9 == 1) {
          (*(code *)(((vector<piece_pos,_piece_index_t> *)local_78._8_8_)->
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ).
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start[3])();
        }
      }
    }
    iVar9 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
    if ((char)iVar9 != '\0') {
      pcVar4 = (pbVar7->_M_dataplus)._M_p;
      uVar1 = e->val_;
      (*e->cat_->_vptr_error_category[4])(local_a0,e->cat_,(ulong)uVar1);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** HOSTNAME LOOKUP FAILED: %s: (%d) %s",pcVar4,(ulong)uVar1,local_a0._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._0_8_ != &local_90) {
        operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
      }
    }
    tVar11 = time_now32();
    iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x2e])();
    local_a0._0_8_ = CONCAT44(extraout_var_04,iVar9) + 0x438;
    local_a0[8] = false;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_a0);
    local_a0[8] = true;
    iVar9 = *(int *)(CONCAT44(extraout_var_04,iVar9) + 0x3a8);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_a0);
    *(int *)((long)&web._M_node[6]._M_prev + 4) = (int)tVar11.__d.__r + iVar9;
  }
  return;
}

Assistant:

void torrent::on_name_lookup(error_code const& e
		, std::vector<address> const& addrs
		, int const port
		, std::list<web_seed_t>::iterator web) try
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

		TORRENT_ASSERT(web->resolving);
#ifndef TORRENT_DISABLE_LOGGING
		debug_log("completed resolve: %s", web->url.c_str());
#endif
		web->resolving = false;
		if (web->removed)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("removed web seed");
#endif
			remove_web_seed_iter(web);
			return;
		}

		if (m_abort) return;

		if (e || addrs.empty())
		{
			if (m_ses.alerts().should_post<url_seed_alert>())
				m_ses.alerts().emplace_alert<url_seed_alert>(get_handle(), web->url, e);
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				debug_log("*** HOSTNAME LOOKUP FAILED: %s: (%d) %s"
					, web->url.c_str(), e.value(), e.message().c_str());
			}
#endif

			// unavailable, retry in `settings_pack::web_seed_name_lookup_retry` seconds
			web->retry = aux::time_now32()
				+ seconds32(settings().get_int(settings_pack::web_seed_name_lookup_retry));
			return;
		}

		for (auto const& addr : addrs)
		{
			// if this is set, we don't allow this web seed to have resolved to a
			// local IP
			if (web->no_local_ips && !aux::is_global(addr)) continue;

			// fill in the peer struct's address field
			web->endpoints.emplace_back(addr, std::uint16_t(port));

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
				debug_log("  -> %s", print_endpoint(tcp::endpoint(addr, std::uint16_t(port))).c_str());
#endif
		}

		if (web->endpoints.empty())
		{
			if (m_ses.alerts().should_post<url_seed_alert>())
			{
				m_ses.alerts().emplace_alert<url_seed_alert>(get_handle()
					, web->url, errors::banned_by_ip_filter);
			}

			// the name lookup failed for the http host. Don't try
			// this host again
			web->disabled = true;
			return;
		}

		if (num_peers() >= int(m_max_connections)
			|| m_ses.num_connections() >= settings().get_int(settings_pack::connections_limit))
			return;

		connect_web_seed(web, web->endpoints.front());
	}
	catch (...) { handle_exception(); }